

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsItemActivated(void)

{
  ImGuiID IVar1;
  bool bVar2;
  
  IVar1 = GImGui->ActiveId;
  if (((IVar1 == 0) || (IVar1 != (GImGui->CurrentWindow->DC).LastItemId)) ||
     (bVar2 = true, GImGui->ActiveIdPreviousFrame == IVar1)) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::IsItemActivated()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId)
    {
        ImGuiWindow* window = g.CurrentWindow;
        if (g.ActiveId == window->DC.LastItemId && g.ActiveIdPreviousFrame != window->DC.LastItemId)
            return true;
    }
    return false;
}